

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

NodeData * __thiscall c4::yml::Parser::_append_key_val(Parser *this,csubstr val,flag_t val_quoted)

{
  size_t sVar1;
  csubstr tag;
  csubstr tag_00;
  csubstr tag_01;
  csubstr tag_02;
  Location loc;
  Location loc_00;
  Location loc_01;
  csubstr key_00;
  bool bVar2;
  error_flags eVar3;
  NodeData *pNVar4;
  Parser *pPVar5;
  Tree *this_00;
  long in_RDI;
  csubstr cVar6;
  size_t nid;
  csubstr key;
  type_bits additional_flags;
  char msg [49];
  size_t child;
  size_t in_stack_00000248;
  size_t in_stack_00000250;
  size_t in_stack_00000258;
  Tree *in_stack_00000260;
  size_t in_stack_fffffffffffffd88;
  Parser *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  Location *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  Location *in_stack_fffffffffffffdb0;
  Parser *in_stack_fffffffffffffdd8;
  Tree *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 uVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  undefined1 *in_stack_fffffffffffffe08;
  code *in_stack_fffffffffffffe10;
  size_t in_stack_fffffffffffffe48;
  Parser *in_stack_fffffffffffffe50;
  flag_t fStack_164;
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  Parser *in_stack_fffffffffffffec0;
  undefined1 local_138 [80];
  size_t in_stack_ffffffffffffff18;
  Tree *in_stack_ffffffffffffff20;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  size_t sVar15;
  Parser *in_stack_ffffffffffffff60;
  size_t local_80;
  Parser *pPStack_78;
  char *local_70;
  Location *pLStack_68;
  type_bits in_stack_ffffffffffffffa0;
  size_t local_58;
  Parser *pPStack_50;
  char *local_48;
  Location *pLStack_40;
  
  sVar15 = *(size_t *)(in_RDI + 0x30);
  pcVar14 = *(char **)(*(long *)(in_RDI + 0x9f0) + 0x10);
  pNVar4 = Tree::_p(in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
  if (((pNVar4->m_type).type & MAP) == NOTYPE) {
    memcpy(local_138,"check failed: (m_tree->is_map(m_state->node_id))",0x31);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    in_stack_fffffffffffffe10 = *(code **)(in_RDI + 0x9e8);
    in_stack_fffffffffffffe08 = local_138;
    Location::Location(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                       (size_t)in_stack_fffffffffffffda0,(size_t)in_stack_fffffffffffffd98,
                       (size_t)in_stack_fffffffffffffd90);
    in_stack_fffffffffffffd98 = (char *)CONCAT44(uStack_14c,local_150);
    in_stack_fffffffffffffda0 =
         (Location *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffd88 = CONCAT44(uStack_15c,local_160);
    in_stack_fffffffffffffd90 = (Parser *)CONCAT44(uStack_154,uStack_158);
    (*in_stack_fffffffffffffe10)(in_stack_fffffffffffffe08,0x31,*(undefined8 *)(in_RDI + 0x9d0));
  }
  fStack_164 = 0;
  _consume_scalar(in_stack_fffffffffffffdd8);
  pcVar8 = *(char **)(in_RDI + 0x30);
  pcVar9 = *(char **)(*(long *)(in_RDI + 0x9f0) + 0x10);
  pcVar12 = pcVar9;
  pcVar13 = pcVar8;
  pNVar4 = Tree::_p(in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
  sVar1 = pNVar4->m_last_child;
  pcVar10 = pcVar9;
  pcVar11 = pcVar8;
  if (pcVar9 == (char *)0xffffffffffffffff) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                       (size_t)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    loc.super_LineCol.line = (size_t)pcVar10;
    loc.super_LineCol.offset = (size_t)pcVar8;
    loc.super_LineCol.col = (size_t)pcVar11;
    loc.name.str = in_stack_fffffffffffffe08;
    loc.name.len = (size_t)in_stack_fffffffffffffe10;
    error<29ul>((char (*) [29])in_stack_fffffffffffffde0,loc);
    in_stack_fffffffffffffd88 = local_58;
    in_stack_fffffffffffffd90 = pPStack_50;
    in_stack_fffffffffffffd98 = local_48;
    in_stack_fffffffffffffda0 = pLStack_40;
  }
  pNVar4 = Tree::_p(in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
  if ((((pNVar4->m_type).type & (STREAM|MAP)) == NOTYPE) &&
     (bVar2 = Tree::is_root(in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8), !bVar2)) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                       (size_t)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    loc_00.super_LineCol.line = (size_t)pcVar10;
    loc_00.super_LineCol.offset = (size_t)pcVar8;
    loc_00.super_LineCol.col = (size_t)pcVar11;
    loc_00.name.str = in_stack_fffffffffffffe08;
    loc_00.name.len = (size_t)in_stack_fffffffffffffe10;
    error<54ul>((char (*) [54])in_stack_fffffffffffffde0,loc_00);
    in_stack_fffffffffffffd88 = local_80;
    in_stack_fffffffffffffd90 = pPStack_78;
    in_stack_fffffffffffffd98 = local_70;
    in_stack_fffffffffffffda0 = pLStack_68;
  }
  if ((sVar1 != 0xffffffffffffffff) &&
     (pNVar4 = Tree::_p(in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8),
     (char *)pNVar4->m_parent != pcVar9)) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                       (size_t)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    in_stack_fffffffffffffd90 = in_stack_ffffffffffffff60;
    loc_01.super_LineCol.line = (size_t)pcVar10;
    loc_01.super_LineCol.offset = (size_t)pcVar8;
    loc_01.super_LineCol.col = (size_t)pcVar11;
    loc_01.name.str = in_stack_fffffffffffffe08;
    loc_01.name.len = (size_t)in_stack_fffffffffffffe10;
    in_stack_ffffffffffffff60 = in_stack_fffffffffffffd90;
    error<63ul>((char (*) [63])in_stack_fffffffffffffde0,loc_01);
  }
  pPVar5 = (Parser *)Tree::_claim((Tree *)in_stack_ffffffffffffff60);
  Tree::_set_hierarchy(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_00000248);
  key_00.len = sVar15;
  key_00.str = pcVar14;
  cVar6.len = (size_t)pcVar13;
  cVar6.str = pcVar12;
  Tree::to_keyval(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,key_00,cVar6,
                  in_stack_ffffffffffffffa0);
  this_00 = (Tree *)(in_RDI + 0xa08);
  uVar7 = true;
  if (*(long *)(in_RDI + 0xa10) != 0) {
    uVar7 = this_00->m_buf == (NodeData *)0x0;
  }
  if ((bool)uVar7 == false) {
    in_stack_fffffffffffffe48 = *(size_t *)(in_RDI + 0xa10);
    tag.len = (size_t)this_00;
    tag.str = (char *)pPVar5;
    cVar6 = normalize_tag(tag);
    in_stack_fffffffffffffe50 = (Parser *)cVar6.str;
    tag_02.len = (size_t)pcVar10;
    tag_02.str = pcVar8;
    Tree::set_key_tag((Tree *)CONCAT17(uVar7,in_stack_fffffffffffffde8),(size_t)this_00,tag_02);
    basic_substring<const_char>::clear((basic_substring<const_char> *)(in_RDI + 0xa08));
    in_stack_fffffffffffffdd8 = pPVar5;
  }
  bVar2 = true;
  if (*(long *)(in_RDI + 0xa38) != 0) {
    bVar2 = *(long *)(in_RDI + 0xa30) == 0;
  }
  if (!bVar2) {
    tag_00.len = (size_t)this_00;
    tag_00.str = (char *)in_stack_fffffffffffffdd8;
    normalize_tag(tag_00);
    tag_01.str._7_1_ = uVar7;
    tag_01.str._0_7_ = in_stack_fffffffffffffde8;
    tag_01.len = (size_t)pcVar8;
    Tree::set_val_tag(this_00,(size_t)in_stack_fffffffffffffdd8,tag_01);
    basic_substring<const_char>::clear((basic_substring<const_char> *)(in_RDI + 0xa30));
  }
  _write_key_anchor(in_stack_fffffffffffffec0,
                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  _write_val_anchor(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  rem_flags(in_stack_fffffffffffffd90,fStack_164);
  pNVar4 = Tree::get((Tree *)CONCAT17(uVar7,in_stack_fffffffffffffde8),(size_t)this_00);
  return pNVar4;
}

Assistant:

NodeData* Parser::_append_key_val(csubstr val, flag_t val_quoted)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_map(m_state->node_id));
    type_bits additional_flags = 0;
    if(m_state->flags & QSCL)
        additional_flags |= KEYQUO;
    if(val_quoted)
        additional_flags |= VALQUO;

    csubstr key = _consume_scalar();
    _c4dbgpf("append keyval: '{}' '{}' to parent id={} (level={}){}{}", key, val, m_state->node_id, m_state->level, (additional_flags & KEYQUO) ? " KEYQUO!" : "", (additional_flags & VALQUO) ? " VALQUO!" : "");
    size_t nid = m_tree->append_child(m_state->node_id);
    m_tree->to_keyval(nid, key, val, additional_flags);
    _c4dbgpf("append keyval: id={} key='{}' val='{}'", nid, m_tree->key(nid), m_tree->val(nid));
    if( ! m_key_tag.empty())
    {
        _c4dbgpf("append keyval[{}]: set key tag='{}' -> '{}'", nid, m_key_tag, normalize_tag(m_key_tag));
        m_tree->set_key_tag(nid, normalize_tag(m_key_tag));
        m_key_tag.clear();
    }
    if( ! m_val_tag.empty())
    {
        _c4dbgpf("append keyval[{}]: set val tag='{}' -> '{}'", nid, m_val_tag, normalize_tag(m_val_tag));
        m_tree->set_val_tag(nid, normalize_tag(m_val_tag));
        m_val_tag.clear();
    }
    _write_key_anchor(nid);
    _write_val_anchor(nid);
    rem_flags(QMRK);
    return m_tree->get(nid);
}